

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

auto_ptr<cmFileListGeneratorBase> __thiscall
cmFileListGeneratorGlob::Clone(cmFileListGeneratorGlob *this)

{
  cmFileListGeneratorGlob *this_00;
  cmFileListGeneratorGlob *in_RSI;
  cmFileListGeneratorGlob *this_local;
  auto_ptr<cmFileListGeneratorBase> *g;
  
  this_00 = (cmFileListGeneratorGlob *)operator_new(0x30);
  cmFileListGeneratorGlob(this_00,in_RSI);
  cmsys::auto_ptr<cmFileListGeneratorBase>::auto_ptr
            ((auto_ptr<cmFileListGeneratorBase> *)this,(cmFileListGeneratorBase *)this_00);
  return (auto_ptr<cmFileListGeneratorBase>)&this->super_cmFileListGeneratorBase;
}

Assistant:

virtual cmsys::auto_ptr<cmFileListGeneratorBase> Clone() const
    {
    cmsys::auto_ptr<cmFileListGeneratorBase>
      g(new cmFileListGeneratorGlob(*this));
    return g;
    }